

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O2

void __thiscall btRaycastVehicle::updateSuspension(btRaycastVehicle *this,btScalar deltaTime)

{
  btWheelInfo *this_00;
  float fVar1;
  btWheelInfo *pbVar2;
  int w_it;
  long lVar3;
  long lVar4;
  btScalar bVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = this->m_chassisBody->m_inverseMass;
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < (this->m_wheelInfo).m_size; lVar3 = lVar3 + 1) {
    pbVar2 = (this->m_wheelInfo).m_data;
    fVar7 = 0.0;
    if (*(bool *)((long)(&(pbVar2->m_raycastInfo).m_wheelAxleWS + 1) + lVar4) == true) {
      this_00 = (btWheelInfo *)((long)(pbVar2->m_raycastInfo).m_contactNormalWS.m_floats + lVar4);
      bVar5 = btWheelInfo::getSuspensionRestLength(this_00);
      fVar7 = *(float *)((long)(&pbVar2->m_wheelAxleCS + 5) + lVar4 + 0xc);
      fVar6 = ((bVar5 - *(float *)((long)(pbVar2->m_raycastInfo).m_hardPointWS.m_floats + lVar4 + -4
                                  )) * *(float *)((long)(&pbVar2->m_wheelAxleCS + 1) + lVar4 + 0xc)
               * *(float *)((long)(&pbVar2->m_wheelAxleCS + 5) + lVar4 + 8) -
              fVar7 * *(btScalar *)((long)(&this_00->m_wheelAxleCS + 2) + (ulong)(0.0 <= fVar7) * 4)
              ) * (1.0 / fVar1);
      fVar7 = 0.0;
      if (0.0 <= fVar6) {
        fVar7 = fVar6;
      }
    }
    *(float *)((long)(&pbVar2->m_wheelAxleCS + 6) + lVar4) = fVar7;
    lVar4 = lVar4 + 0x128;
  }
  return;
}

Assistant:

void	btRaycastVehicle::updateSuspension(btScalar deltaTime)
{
	(void)deltaTime;

	btScalar chassisMass = btScalar(1.) / m_chassisBody->getInvMass();
	
	for (int w_it=0; w_it<getNumWheels(); w_it++)
	{
		btWheelInfo &wheel_info = m_wheelInfo[w_it];
		
		if ( wheel_info.m_raycastInfo.m_isInContact )
		{
			btScalar force;
			//	Spring
			{
				btScalar	susp_length			= wheel_info.getSuspensionRestLength();
				btScalar	current_length = wheel_info.m_raycastInfo.m_suspensionLength;

				btScalar length_diff = (susp_length - current_length);

				force = wheel_info.m_suspensionStiffness
					* length_diff * wheel_info.m_clippedInvContactDotSuspension;
			}
		
			// Damper
			{
				btScalar projected_rel_vel = wheel_info.m_suspensionRelativeVelocity;
				{
					btScalar	susp_damping;
					if ( projected_rel_vel < btScalar(0.0) )
					{
						susp_damping = wheel_info.m_wheelsDampingCompression;
					}
					else
					{
						susp_damping = wheel_info.m_wheelsDampingRelaxation;
					}
					force -= susp_damping * projected_rel_vel;
				}
			}

			// RESULT
			wheel_info.m_wheelsSuspensionForce = force * chassisMass;
			if (wheel_info.m_wheelsSuspensionForce < btScalar(0.))
			{
				wheel_info.m_wheelsSuspensionForce = btScalar(0.);
			}
		}
		else
		{
			wheel_info.m_wheelsSuspensionForce = btScalar(0.0);
		}
	}

}